

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O3

bool ReadBase(ON_BinaryArchive *archive,ON_SubDComponentBase *base)

{
  bool bVar1;
  int iVar2;
  uchar deprecated_and_never_used_char;
  uchar cP;
  unsigned_short level;
  uint id;
  uint archive_id;
  uchar sz;
  double P [3];
  ON__UINT8 local_64;
  ON__UINT8 local_63;
  ON__UINT16 local_62;
  ON__UINT32 local_60;
  ON__UINT32 local_5c;
  double local_58 [4];
  double local_38 [4];
  
  local_5c = 0;
  local_60 = 0;
  local_62 = 0;
  bVar1 = ON_BinaryArchive::ReadInt(archive,&local_5c);
  if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(archive,&local_60), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadShort(archive,&local_62), bVar1)) {
    base->m_id = local_60;
    if (local_5c != 0xffffffff) {
      base->m_archive_id = local_5c;
    }
    ON_SubDComponentBase::SetSubdivisionLevel(base,(uint)local_62);
    iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
    if (iVar2 < 0x46) {
      local_63 = '\0';
      local_64 = '\0';
      bVar1 = ON_BinaryArchive::ReadChar(archive,&local_63);
      if (bVar1) {
        if ((local_63 == '\0') || (bVar1 = ON_BinaryArchive::ReadDouble(archive,3,local_38), bVar1))
        {
          bVar1 = ON_BinaryArchive::ReadChar(archive,&local_64);
          if (!bVar1) goto LAB_005f68cf;
          if ((local_64 == '\0') ||
             (bVar1 = ON_BinaryArchive::ReadDouble(archive,3,local_58), bVar1)) {
            if (local_63 == '\x04') {
              ON_SubDComponentBase::SetSavedSubdivisionPoint(base,local_38);
            }
            return true;
          }
        }
        ON_SubDIncrementErrorCount();
      }
    }
    else {
      local_58[0]._0_1_ = '\0';
      bVar1 = Internal_ReadComponentAdditionSize(archive,'\x18',(uchar *)local_58);
      if (bVar1) {
        if (local_58[0]._0_1_ != '\0') {
          if (local_58[0]._0_1_ == -1) {
            return true;
          }
          local_38[0] = 0.0;
          local_38[1] = 0.0;
          local_38[2] = 0.0;
          bVar1 = ON_BinaryArchive::ReadDouble(archive,3,local_38);
          if (!bVar1) goto LAB_005f68cf;
        }
        local_58[0]._0_1_ = '\0';
        bVar1 = Internal_ReadComponentAdditionSize(archive,'\x04',(uchar *)local_58);
        if (bVar1) {
          if (local_58[0]._0_1_ != '\0') {
            if (local_58[0]._0_1_ == -1) {
              return true;
            }
            bVar1 = ON_BinaryArchive::ReadInt(archive,&base->m_group_id);
            if (!bVar1) goto LAB_005f68cf;
          }
          local_58[0]._0_1_ = '\0';
          bVar1 = Internal_ReadComponentAdditionSize(archive,'\x05',(uchar *)local_58);
          if (bVar1) {
            if (local_58[0]._0_1_ != '\0') {
              if (local_58[0]._0_1_ == -1) {
                return true;
              }
              bVar1 = Internal_ReadArchiveIdAndFlagsIntoComponentPtr
                                (archive,&(base->m_symmetry_set_next).m_ptr);
              if (!bVar1) goto LAB_005f68cf;
            }
            bVar1 = Internal_FinishReadingComponentAdditions(archive);
            return bVar1;
          }
        }
      }
    }
  }
LAB_005f68cf:
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool ReadBase(
  ON_BinaryArchive& archive,
  ON_SubDComponentBase& base
  )
{
  unsigned int archive_id = 0;
  unsigned int id = 0;
  unsigned short level = 0;
  for (;;)
  {
    if (!archive.ReadInt(&archive_id))
      break;
    if (!archive.ReadInt(&id))
      break;
    if (!archive.ReadShort(&level))
      break;

    base.m_id = id;
    base.SetArchiveId(archive_id);
    base.SetSubdivisionLevel(level);

    if (archive.Archive3dmVersion() < 70)
    {
      unsigned char cP = 0U;
      unsigned char deprecated_and_never_used_char = 0U;
      double P[3];

      if (!archive.ReadChar(&cP))
        break;
      if (0 != cP)
      {
        if (!Internal_ReadDouble3(archive, P))
          break;
      }

      if (!archive.ReadChar(&deprecated_and_never_used_char))
        break;
      if (0 != deprecated_and_never_used_char)
      {
        double deprecated_and_never_used_V[3];
        if (!Internal_ReadDouble3(archive, deprecated_and_never_used_V))
          break;
      }
      if (4 == cP)
        base.SetSavedSubdivisionPoint(P);
      return true;
    }

    // read additions
    unsigned char sz;

    // 24 byte displacement addition
    // This addition was a deprecated prototype that was never used in commercial Rhino.
    sz = 0;
    if (false == Internal_ReadComponentAdditionSize(archive, 24, &sz))
      break;
    if (ON_SubDComponentArchiveAdditionEndMark == sz)
      return true; // end of additions
    if (0 != sz)
    {
      double deprecated_and_never_used_V[3] = {};
      if (!archive.ReadDouble(3, deprecated_and_never_used_V))
        break;
    }

    // 4 byte group id addition
    sz = 0;
    if (false == Internal_ReadComponentAdditionSize(archive, 4, &sz))
      break;
    if (ON_SubDComponentArchiveAdditionEndMark == sz)
      return true; // end of additions
    if (0 != sz)
    {
      if (!archive.ReadInt(&base.m_group_id))
        break;
    }

    // 5 bytes symmetry set next addition Dec 2020 Rhino 7.2 and later
    // 5 bytes = unsigned archive id + char flags
    sz = 0;
    if (false == Internal_ReadComponentAdditionSize(archive, 5, &sz))
      break;
    if (ON_SubDComponentArchiveAdditionEndMark == sz)
      return true; // end of additions
    if (0 != sz)
    {
      if (!Internal_ReadSymmetrySetNext(archive,base))
        break;
    }

    
    return Internal_FinishReadingComponentAdditions(archive);
  }

  return ON_SUBD_RETURN_ERROR(false);
}